

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> * __thiscall
tinyusdz::MetaVariable::get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
          (optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
           *__return_storage_ptr__,MetaVariable *this)

{
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *value;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *v;
  MetaVariable *this_local;
  
  value = tinyusdz::value::Value::as<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                    (&this->_value,false);
  if (value == (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)0x0) {
    nonstd::optional_lite::optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
    ::optional(__return_storage_ptr__);
  }
  else {
    nonstd::optional_lite::optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
    ::optional<const_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_&,_0>
              (__return_storage_ptr__,value);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    if (const T *v = _value.as<T>()) {
      return *v;
    }

    return nonstd::nullopt;
  }